

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_2dPoint * __thiscall ON_2dPoint::operator=(ON_2dPoint *this,double *p)

{
  double *p_local;
  ON_2dPoint *this_local;
  
  if (p == (double *)0x0) {
    this->y = 0.0;
    this->x = 0.0;
  }
  else {
    this->x = *p;
    this->y = p[1];
  }
  return this;
}

Assistant:

ON_2dPoint& ON_2dPoint::operator=(const double* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}